

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O2

char * blogc_content_parse(char *src,size_t *end_excerpt,char **first_header,char **description,
                          char **endl,bc_slist_t **headers)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  byte *__ptr;
  bc_string_t *str;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  bc_string_t *pbVar10;
  byte *text;
  byte *slug;
  bc_slist_t *pbVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  byte *pbVar15;
  byte bVar16;
  bc_slist_t *l_3;
  _bc_slist_t *p_Var17;
  byte bVar18;
  byte *pbVar19;
  byte *pbVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  bc_slist_t *l;
  bool bVar24;
  bc_slist_t *local_f8;
  ulong local_f0;
  char *local_e8;
  bc_slist_t *local_e0;
  ulong local_d8;
  ulong local_b0;
  ulong local_98;
  size_t local_78;
  byte *local_70;
  size_t local_60;
  
  sVar6 = strlen(src);
  if (endl == (char **)0x0) {
    __ptr = (byte *)bc_malloc(3);
  }
  else {
    __ptr = (byte *)*endl;
    bVar2 = true;
    if (__ptr != (byte *)0x0) goto LAB_001067fd;
    __ptr = (byte *)bc_malloc(3);
    *endl = (char *)__ptr;
  }
  __ptr[0] = 10;
  __ptr[1] = 0;
  bVar2 = false;
LAB_001067fd:
  str = bc_string_new();
  local_d8 = 0;
  local_b0 = 0;
  local_78 = 0;
  local_98 = 0;
  local_70 = (byte *)0x0;
  local_e8 = (char *)0x0;
  local_60 = 0;
  local_f8 = (bc_slist_t *)0x0;
  local_e0 = (bc_slist_t *)0x0;
  local_f0 = 0;
  uVar22 = 0;
  bVar4 = 0;
  iVar5 = 1;
  do {
    pcVar7 = src + local_d8;
LAB_001068b1:
    if (sVar6 <= uVar22) {
      if (endl == (char **)0x0) {
        free(__ptr);
      }
      pcVar7 = bc_string_free(str,false);
      return pcVar7;
    }
    bVar18 = src[uVar22];
    bVar24 = uVar22 == sVar6 - 1;
    if ((bVar18 == 0xd) || (bVar18 == 10)) {
      uVar1 = uVar22 + 1;
      uVar14 = uVar22;
      if (uVar1 < sVar6) {
        if (bVar18 == 0xd) {
          bVar16 = 10;
          if (src[uVar1] == '\n') {
LAB_00106919:
            if (!bVar2) {
              *__ptr = bVar18;
              __ptr[1] = src[uVar1];
              __ptr[2] = 0;
              bVar2 = true;
              bVar16 = src[uVar1];
            }
            bVar18 = bVar16;
            bVar24 = uVar1 == sVar6 - 1;
            uVar14 = uVar1;
            local_98 = uVar22;
          }
          else {
            bVar18 = 0xd;
          }
        }
        else if (bVar18 == 10) {
          bVar16 = 0xd;
          if (src[uVar1] == '\r') goto LAB_00106919;
          bVar18 = 10;
        }
      }
      uVar22 = uVar14;
      if (!bVar2) {
        *__ptr = bVar18;
        __ptr[1] = 0;
        bVar2 = true;
      }
    }
    uVar1 = local_d8;
    bVar16 = bVar4;
    iVar23 = iVar5;
    if (0x18 < iVar5 - 1U) goto LAB_00107cec;
    iVar23 = 0xf;
    uVar21 = (uint)bVar18;
    uVar1 = uVar22;
    switch(iVar5) {
    case 1:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (bVar24)) {
        iVar23 = 1;
        uVar1 = local_d8;
      }
      else if ((end_excerpt == (size_t *)0x0) || (bVar18 != 0x2e)) {
        local_f0 = uVar22;
        bVar16 = bVar18;
        if (1 < uVar21 - 0x2a) {
          if (uVar21 == 0x23) {
            local_70 = (byte *)0x1;
            iVar23 = 4;
            uVar1 = local_d8;
            bVar16 = bVar4;
          }
          else if (uVar21 != 0x2d) {
            if ((byte)(bVar18 - 0x30) < 10) {
              iVar23 = 0x14;
              bVar16 = bVar4;
            }
            else if ((bVar18 == 9) || (uVar21 == 0x20)) {
              iVar23 = 0xc;
              bVar16 = bVar4;
            }
            else if (uVar21 == 0x3e) {
              iVar23 = 9;
              bVar16 = bVar4;
            }
            else if (uVar21 == 0x3c) {
              iVar23 = 7;
              uVar1 = local_d8;
              bVar16 = bVar4;
            }
            else {
              iVar23 = 0x18;
              uVar1 = local_d8;
              bVar16 = bVar4;
            }
          }
        }
      }
      else {
        local_78 = str->len;
        iVar23 = 2;
        local_f0 = uVar22;
        uVar1 = local_d8;
      }
      break;
    case 2:
      iVar23 = 0x18;
      if (end_excerpt != (size_t *)0x0) {
        if ((bVar18 == 10) || (uVar21 == 0xd)) {
          iVar23 = 3;
          uVar1 = local_d8;
          break;
        }
        if (uVar21 == 0x2e) {
          iVar23 = 2;
          uVar1 = local_d8;
          break;
        }
      }
      local_78 = 0;
      uVar1 = local_d8;
      break;
    case 3:
      if ((end_excerpt == (size_t *)0x0) || ((bVar18 != 0xd && (uVar21 != 10)))) {
        local_78 = 0;
        iVar23 = 0x19;
        uVar1 = local_d8;
      }
      else {
        *end_excerpt = local_78;
        iVar23 = 1;
        uVar1 = local_d8;
      }
      break;
    case 4:
      if ((bVar18 == 9) || (uVar21 == 0x20)) {
        iVar23 = 5;
        uVar1 = local_d8;
      }
      else if (uVar21 == 0x23) {
        local_70 = local_70 + 1;
        uVar1 = local_d8;
        iVar23 = 4;
      }
      else {
        uVar1 = local_d8;
        iVar23 = 0x18;
      }
      break;
    case 5:
      uVar1 = local_d8;
      iVar23 = 5;
      if (bVar18 != 9) {
        uVar14 = uVar22;
        if ((uVar21 == 10) || (uVar21 == 0xd)) goto LAB_0010718c;
        if (uVar21 != 0x20) {
          local_f0 = uVar22;
          iVar23 = 6;
        }
      }
      break;
    case 6:
      uVar14 = local_f0;
LAB_0010718c:
      if (((bVar18 == 10) || (uVar21 == 0xd)) ||
         (local_f0 = uVar14, uVar1 = local_d8, iVar23 = iVar5, bVar24)) {
        if ((((!bVar24) || (bVar18 == 0xd)) || (local_b0 = sVar6, uVar21 == 10)) &&
           (local_b0 = local_98, local_98 == 0)) {
          local_b0 = uVar22;
        }
        pcVar7 = bc_strndup(src + uVar14,local_b0 - uVar14);
        if ((first_header != (char **)0x0) && (*first_header == (char *)0x0)) {
          pcVar12 = blogc_htmlentities(pcVar7);
          *first_header = pcVar12;
        }
        text = (byte *)blogc_content_parse_inline(pcVar7);
        slug = (byte *)blogc_slugify(pcVar7);
        if (headers != (bc_slist_t **)0x0) {
          pbVar11 = blogc_toctree_append(*headers,(size_t)local_70,(char *)slug,(char *)text);
          *headers = pbVar11;
        }
        if (slug == (byte *)0x0) {
          pcVar12 = "<h%d>%s</h%d>%s";
          pbVar15 = text;
          pbVar19 = local_70;
          pbVar20 = __ptr;
        }
        else {
          pcVar12 = "<h%d id=\"%s\">%s</h%d>%s";
          pbVar15 = slug;
          pbVar19 = text;
          pbVar20 = local_70;
        }
        bc_string_append_printf(str,pcVar12,local_70,pbVar15,pbVar19,pbVar20);
        free(slug);
        free(text);
        free(pcVar7);
LAB_001076ef:
        local_f0 = uVar22;
        uVar1 = local_d8;
        bVar16 = bVar4;
        iVar23 = 1;
      }
      break;
    case 7:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (uVar1 = local_d8, iVar23 = 7, bVar24)) {
        if (bVar24) {
          if (((bVar18 == 0xd) || (local_b0 = sVar6, uVar21 == 10)) &&
             (local_b0 = local_98, local_98 == 0)) {
            local_b0 = uVar22;
          }
          goto LAB_00107026;
        }
        local_b0 = local_98;
        if (local_98 == 0) {
          local_b0 = uVar22;
        }
        uVar1 = local_d8;
        iVar23 = 8;
      }
      break;
    case 8:
LAB_00107026:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (uVar1 = local_d8, iVar23 = 7, bVar24)) {
        pcVar7 = bc_strndup(src + local_f0,local_b0 - local_f0);
        bc_string_append_printf(str,"%s%s",pcVar7,__ptr);
LAB_00107524:
        free(pcVar7);
        goto LAB_001076ef;
      }
      break;
    case 9:
      uVar1 = local_d8;
      iVar23 = 9;
      if (bVar18 != 9) {
        if (uVar21 == 0x20) {
          iVar23 = 9;
        }
        else {
          local_e8 = bc_strndup(src + local_f0,uVar22 - local_f0);
          iVar23 = 10;
        }
      }
      break;
    case 10:
      if (((bVar18 != 10) && (uVar21 != 0xd)) && (!bVar24)) {
        uVar1 = local_d8;
        iVar23 = 10;
        break;
      }
      if ((((!bVar24) || (bVar18 == 0xd)) || (local_b0 = sVar6, uVar21 == 10)) &&
         (local_b0 = local_98, local_98 == 0)) {
        local_b0 = uVar22;
      }
      pcVar12 = bc_strndup(pcVar7,local_b0 - local_d8);
      _Var3 = bc_str_starts_with(pcVar12,local_e8);
      if (_Var3) {
        sVar9 = strlen(local_e8);
        pcVar7 = bc_strdup(pcVar12 + sVar9);
        local_f8 = bc_slist_append(local_f8,pcVar7);
        iVar23 = 0xb;
      }
      else {
        free(local_e8);
        bc_slist_free_full(local_f8,free);
        if (bVar24) {
          free(pcVar12);
          iVar5 = 0x18;
          local_e8 = (char *)0x0;
          local_f8 = (bc_slist_t *)0x0;
          goto LAB_001068b1;
        }
        iVar23 = 0x18;
        local_e8 = (char *)0x0;
        local_f8 = (bc_slist_t *)0x0;
      }
      free(pcVar12);
      uVar1 = local_d8;
      if (bVar24) goto LAB_0010710c;
      break;
    case 0xb:
LAB_0010710c:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (bVar24)) {
        pbVar10 = bc_string_new();
        for (p_Var17 = local_f8; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
          bc_string_append_printf(pbVar10,"%s%s",p_Var17->data);
        }
        pcVar7 = blogc_content_parse(pbVar10->str,(size_t *)0x0,(char **)0x0,(char **)0x0,endl,
                                     (bc_slist_t **)0x0);
        bc_string_append_printf(str,"<blockquote>%s</blockquote>%s",pcVar7,__ptr);
        free(pcVar7);
        bc_string_free(pbVar10,true);
        bc_slist_free_full(local_f8,free);
        free(local_e8);
        goto LAB_0010785d;
      }
      uVar1 = uVar22;
      iVar23 = 10;
      break;
    case 0xc:
      uVar1 = local_d8;
      iVar23 = 0xc;
      if (bVar18 != 9) {
        if (uVar21 == 0x20) {
          iVar23 = 0xc;
        }
        else {
          local_e8 = bc_strndup(src + local_f0,uVar22 - local_f0);
          iVar23 = 0xd;
        }
      }
      break;
    case 0xd:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (bVar24)) {
        if ((((!bVar24) || (bVar18 == 0xd)) || (local_b0 = sVar6, uVar21 == 10)) &&
           (local_b0 = local_98, local_98 == 0)) {
          local_b0 = uVar22;
        }
        pcVar12 = bc_strndup(pcVar7,local_b0 - local_d8);
        _Var3 = bc_str_starts_with(pcVar12,local_e8);
        if (!_Var3) {
          free(local_e8);
          bc_slist_free_full(local_f8,free);
          free(pcVar12);
          iVar5 = 0x18;
          goto LAB_00106df3;
        }
        sVar9 = strlen(local_e8);
        pcVar7 = bc_strdup(pcVar12 + sVar9);
        local_f8 = bc_slist_append(local_f8,pcVar7);
        free(pcVar12);
        if (bVar24) goto LAB_001073c3;
        uVar1 = local_d8;
        iVar23 = 0xe;
      }
      else {
        uVar1 = local_d8;
        iVar23 = 0xd;
      }
      break;
    case 0xe:
LAB_001073c3:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (bVar24)) {
        bc_string_append(str,"<pre><code>");
        for (p_Var17 = local_f8; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
          pcVar7 = blogc_htmlentities((char *)p_Var17->data);
          if (p_Var17->next == (_bc_slist_t *)0x0) {
            bc_string_append_printf(str,"%s",pcVar7);
          }
          else {
            bc_string_append_printf(str,"%s%s",pcVar7,__ptr);
          }
          free(pcVar7);
        }
        bc_string_append_printf(str,"</code></pre>%s",__ptr);
        goto LAB_0010784a;
      }
      iVar23 = 0xd;
      break;
    case 0xf:
      if (uVar22 == local_f0 + 1) {
        if (bVar18 == bVar4) {
          uVar1 = local_d8;
          iVar23 = 0x10;
        }
        else {
          if (bVar4 != 0x2a) goto LAB_001078c9;
          uVar1 = local_d8;
          if ((bVar18 != 9) && (uVar21 != 0x20)) {
            bVar4 = 0x2a;
            goto LAB_001078c1;
          }
        }
      }
      else {
LAB_001078c9:
        uVar1 = local_d8;
        if ((bVar18 != 9) && (uVar21 != 0x20)) {
          local_e8 = bc_strndup(src + local_f0,uVar22 - local_f0);
          iVar23 = 0x12;
        }
      }
      break;
    case 0x10:
      if (bVar18 != bVar4) {
        uVar1 = local_d8;
        iVar23 = 0x18;
        break;
      }
      iVar5 = 0x11;
      goto joined_r0x00106b6d;
    case 0x11:
      if ((bVar18 != bVar4) || (bVar24)) {
        if ((bVar18 == 10) || ((uVar21 == 0xd || (uVar1 = local_d8, iVar23 = 0x18, bVar24)))) {
          bVar4 = 0;
          bc_string_append_printf(str,"<hr />%s",__ptr);
          goto LAB_001076ef;
        }
      }
      else {
        uVar1 = local_d8;
        iVar23 = 0x11;
      }
      break;
    case 0x12:
      if (((bVar18 != 10) && (uVar21 != 0xd)) && (!bVar24)) {
        uVar1 = local_d8;
        iVar23 = 0x12;
        break;
      }
      if ((((!bVar24) || (bVar18 == 0xd)) || (local_b0 = sVar6, uVar21 == 10)) &&
         (local_b0 = local_98, local_98 == 0)) {
        local_b0 = uVar22;
      }
      pcVar12 = bc_strndup(pcVar7,local_b0 - local_d8);
      sVar9 = strlen(local_e8);
      pcVar8 = bc_strdup_printf("%-*s",sVar9,"");
      _Var3 = bc_str_starts_with(pcVar12,local_e8);
      if (!_Var3) {
        _Var3 = bc_str_starts_with(pcVar12,pcVar8);
        if (_Var3) goto LAB_00107c7e;
        free(pcVar12);
        free(pcVar8);
        free(local_e8);
        bc_slist_free_full(local_f8,free);
        bc_slist_free_full(local_e0,free);
        iVar5 = 0x19;
LAB_00106df3:
        local_e8 = (char *)0x0;
        local_f8 = (bc_slist_t *)0x0;
        if (!bVar24) {
          local_f8 = (bc_slist_t *)0x0;
          uVar1 = local_d8;
          iVar23 = iVar5;
          break;
        }
        goto LAB_001068b1;
      }
      if (local_e0 == (bc_slist_t *)0x0) {
        local_e0 = (bc_slist_t *)0x0;
      }
      else {
        pbVar10 = bc_string_new();
        for (p_Var17 = local_e0; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
          if (p_Var17->next == (_bc_slist_t *)0x0) {
            bc_string_append_printf(pbVar10,"%s",p_Var17->data);
          }
          else {
            bc_string_append_printf(pbVar10,"%s%s",p_Var17->data,__ptr);
          }
        }
        bc_slist_free_full(local_e0,free);
        pcVar7 = blogc_content_parse_inline(pbVar10->str);
        bc_string_free(pbVar10,true);
        pcVar13 = bc_strdup(pcVar7);
        local_f8 = bc_slist_append(local_f8,pcVar13);
        free(pcVar7);
        local_e0 = (bc_slist_t *)0x0;
      }
LAB_00107c7e:
      sVar9 = strlen(local_e8);
      pcVar7 = bc_strdup(pcVar12 + sVar9);
      local_e0 = bc_slist_append(local_e0,pcVar7);
      free(pcVar12);
      free(pcVar8);
      if (bVar24) {
LAB_00106f39:
        if (((bVar18 == 10) || (uVar21 == 0xd)) || (iVar23 = 0x12, bVar24)) {
          if (local_e0 != (bc_slist_t *)0x0) {
            pbVar10 = bc_string_new();
            for (p_Var17 = local_e0; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
              if (p_Var17->next == (_bc_slist_t *)0x0) {
                bc_string_append_printf(pbVar10,"%s",p_Var17->data);
              }
              else {
                bc_string_append_printf(pbVar10,"%s%s",p_Var17->data,__ptr);
              }
            }
            bc_slist_free_full(local_e0,free);
            pcVar7 = blogc_content_parse_inline(pbVar10->str);
            bc_string_free(pbVar10,true);
            pcVar12 = bc_strdup(pcVar7);
            local_f8 = bc_slist_append(local_f8,pcVar12);
            free(pcVar7);
          }
          bc_string_append_printf(str,"<ul>%s",__ptr);
          for (p_Var17 = local_f8; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
            bc_string_append_printf(str,"<li>%s</li>%s",p_Var17->data,__ptr);
          }
          pcVar7 = "</ul>%s";
LAB_00107828:
          local_e0 = (bc_slist_t *)0x0;
          bc_string_append_printf(str,pcVar7,__ptr);
LAB_0010784a:
          bc_slist_free_full(local_f8,free);
          free(local_e8);
LAB_0010785d:
          local_e8 = (char *)0x0;
          local_f8 = (bc_slist_t *)0x0;
          uVar1 = uVar22;
          iVar23 = 1;
        }
      }
      else {
        uVar1 = local_d8;
        iVar23 = 0x13;
      }
      break;
    case 0x13:
      goto LAB_00106f39;
    case 0x14:
      if ((byte)(bVar18 - 0x30) < 10) {
        uVar1 = local_d8;
        iVar23 = 0x14;
        break;
      }
      if (bVar18 == 0x2e) {
        uVar1 = local_d8;
        iVar23 = 0x15;
        break;
      }
      iVar5 = 0x18;
joined_r0x00106b6d:
      uVar1 = local_d8;
      iVar23 = iVar5;
      if (!bVar24) break;
      goto LAB_001068b1;
    case 0x15:
      uVar1 = local_d8;
      iVar23 = 0x15;
      if ((bVar18 != 9) && (uVar21 != 0x20)) {
        local_60 = uVar22 - local_f0;
        if (bVar18 == 10) goto switchD_001069cf_caseD_16;
        if ((uVar21 == 0xd) || (bVar24)) goto LAB_00106a75;
LAB_00107b99:
        uVar1 = local_d8;
        iVar23 = 0x16;
      }
      break;
    case 0x16:
switchD_001069cf_caseD_16:
LAB_00106a75:
      if ((bVar18 != 10) && ((uVar21 != 0xd && (!bVar24)))) goto LAB_00107b99;
      if (((!bVar24) || ((bVar18 == 0xd || (local_b0 = sVar6, uVar21 == 10)))) &&
         (local_b0 = local_98, local_98 == 0)) {
        local_b0 = uVar22;
      }
      pcVar12 = bc_strndup(pcVar7,local_b0 - local_d8);
      pcVar8 = bc_strdup_printf("%-*s",local_60,"");
      _Var3 = blogc_is_ordered_list_item(pcVar12,local_60);
      if (!_Var3) {
        _Var3 = bc_str_starts_with(pcVar12,pcVar8);
        if (_Var3) goto LAB_00107ba6;
        free(pcVar12);
        free(pcVar8);
        bc_slist_free_full(local_f8,free);
        bc_slist_free_full(local_e0,free);
        iVar5 = 0x19;
        local_f8 = (bc_slist_t *)0x0;
        goto joined_r0x00106b6d;
      }
      if (local_e0 == (bc_slist_t *)0x0) {
        local_e0 = (bc_slist_t *)0x0;
      }
      else {
        pbVar10 = bc_string_new();
        for (p_Var17 = local_e0; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
          if (p_Var17->next == (_bc_slist_t *)0x0) {
            bc_string_append_printf(pbVar10,"%s",p_Var17->data);
          }
          else {
            bc_string_append_printf(pbVar10,"%s%s",p_Var17->data,__ptr);
          }
        }
        bc_slist_free_full(local_e0,free);
        pcVar7 = blogc_content_parse_inline(pbVar10->str);
        bc_string_free(pbVar10,true);
        pcVar13 = bc_strdup(pcVar7);
        local_f8 = bc_slist_append(local_f8,pcVar13);
        free(pcVar7);
        local_e0 = (bc_slist_t *)0x0;
      }
LAB_00107ba6:
      pcVar7 = bc_strdup(pcVar12 + local_60);
      local_e0 = bc_slist_append(local_e0,pcVar7);
      free(pcVar12);
      free(pcVar8);
      if (bVar24) {
LAB_00106e41:
        if (((bVar18 == 10) || (uVar21 == 0xd)) || (uVar1 = uVar22, iVar23 = 0x16, bVar24)) {
          if (local_e0 != (bc_slist_t *)0x0) {
            pbVar10 = bc_string_new();
            for (p_Var17 = local_e0; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
              if (p_Var17->next == (_bc_slist_t *)0x0) {
                bc_string_append_printf(pbVar10,"%s",p_Var17->data);
              }
              else {
                bc_string_append_printf(pbVar10,"%s%s",p_Var17->data,__ptr);
              }
            }
            bc_slist_free_full(local_e0,free);
            pcVar7 = blogc_content_parse_inline(pbVar10->str);
            bc_string_free(pbVar10,true);
            pcVar12 = bc_strdup(pcVar7);
            local_f8 = bc_slist_append(local_f8,pcVar12);
            free(pcVar7);
          }
          bc_string_append_printf(str,"<ol>%s",__ptr);
          for (p_Var17 = local_f8; p_Var17 != (bc_slist_t *)0x0; p_Var17 = p_Var17->next) {
            bc_string_append_printf(str,"<li>%s</li>%s",p_Var17->data,__ptr);
          }
          pcVar7 = "</ol>%s";
          goto LAB_00107828;
        }
      }
      else {
        uVar1 = local_d8;
        iVar23 = 0x17;
      }
      break;
    case 0x17:
      goto LAB_00106e41;
    case 0x18:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (uVar1 = local_d8, iVar23 = 0x18, bVar24)) {
        if (bVar24) {
          if (((bVar18 == 0xd) || (local_b0 = sVar6, uVar21 == 10)) &&
             (local_b0 = local_98, local_98 == 0)) {
            local_b0 = uVar22;
          }
          goto LAB_001074a4;
        }
        local_b0 = local_98;
        if (local_98 == 0) {
          local_b0 = uVar22;
        }
        uVar1 = local_d8;
        iVar23 = 0x19;
      }
      break;
    case 0x19:
LAB_001074a4:
      if (((bVar18 == 10) || (uVar21 == 0xd)) || (bVar24)) {
        pcVar7 = bc_strndup(src + local_f0,local_b0 - local_f0);
        if ((description != (char **)0x0) && (*description == (char *)0x0)) {
          pcVar12 = blogc_fix_description(pcVar7);
          *description = pcVar12;
        }
        pcVar12 = blogc_content_parse_inline(pcVar7);
        bc_string_append_printf(str,"<p>%s</p>%s",pcVar12,__ptr);
        free(pcVar12);
        goto LAB_00107524;
      }
LAB_001078c1:
      uVar1 = local_d8;
      bVar16 = bVar4;
      iVar23 = 0x18;
    }
LAB_00107cec:
    local_d8 = uVar1;
    uVar22 = uVar22 + 1;
    bVar4 = bVar16;
    iVar5 = iVar23;
  } while( true );
}

Assistant:

char*
blogc_content_parse(const char *src, size_t *end_excerpt, char **first_header,
    char **description, char **endl, bc_slist_t **headers)
{
    // src is always nul-terminated.
    size_t src_len = strlen(src);

    size_t current = 0;
    size_t start = 0;
    size_t start2 = 0;
    size_t end = 0;
    size_t eend = 0;
    size_t real_end = 0;

    size_t header_level = 0;
    char *prefix = NULL;
    size_t prefix_len = 0;
    char *tmp = NULL;
    char *tmp2 = NULL;
    char *parsed = NULL;
    char *slug = NULL;

    char *line_ending = NULL;
    bool line_ending_found = false;
    if (endl != NULL) {
        if (*endl != NULL) {
            line_ending_found = true;
        }
        else {
            *endl = bc_malloc(3 * sizeof(char));
        }
        line_ending = *endl;
    }
    else {
        line_ending = bc_malloc(3 * sizeof(char));
    }

    // this isn't empty because we need some reasonable default value in the
    // unlikely case that we need to print some line ending before evaluating
    // the "real" value.
    if (!line_ending_found) {
        line_ending[0] = '\n';
        line_ending[1] = '\0';
    }

    char d = '\0';

    bc_slist_t *lines = NULL;
    bc_slist_t *lines2 = NULL;

    bc_string_t *rv = bc_string_new();
    bc_string_t *tmp_str = NULL;

    blogc_content_parser_state_t state = CONTENT_START_LINE;

    while (current < src_len) {
        char c = src[current];
        bool is_last = current == src_len - 1;

        if (c == '\n' || c == '\r') {
            if ((current + 1) < src_len) {
                if ((c == '\n' && src[current + 1] == '\r') ||
                    (c == '\r' && src[current + 1] == '\n'))
                {
                    if (!line_ending_found) {
                        line_ending[0] = c;
                        line_ending[1] = src[current + 1];
                        line_ending[2] = '\0';
                        line_ending_found = true;
                    }
                    real_end = current;
                    c = src[++current];
                    is_last = current == src_len - 1;
                }
            }
            if (!line_ending_found) {
                line_ending[0] = c;
                line_ending[1] = '\0';
                line_ending_found = true;
            }
        }

        switch (state) {

            case CONTENT_START_LINE:
                if (c == '\n' || c == '\r' || is_last)
                    break;
                start = current;
                if (c == '.') {
                    if (end_excerpt != NULL) {
                        eend = rv->len;  // fuck it
                        state = CONTENT_EXCERPT;
                        break;
                    }
                }
                if (c == '#') {
                    header_level = 1;
                    state = CONTENT_HEADER;
                    break;
                }
                if (c == '*' || c == '+' || c == '-') {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS;
                    d = c;
                    break;
                }
                if (c >= '0' && c <= '9') {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    start2 = current;
                    state = CONTENT_CODE;
                    break;
                }
                if (c == '<') {
                    state = CONTENT_HTML;
                    break;
                }
                if (c == '>') {
                    state = CONTENT_BLOCKQUOTE;
                    start2 = current;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT:
                if (end_excerpt != NULL) {
                    if (c == '.')
                        break;
                    if (c == '\n' || c == '\r') {
                        state = CONTENT_EXCERPT_END;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_EXCERPT_END:
                if (end_excerpt != NULL) {
                    if (c == '\n' || c == '\r') {
                        *end_excerpt = eend;
                        state = CONTENT_START_LINE;
                        break;
                    }
                }
                eend = 0;
                state = CONTENT_PARAGRAPH_END;
                break;

            case CONTENT_HEADER:
                if (c == '#') {
                    header_level += 1;
                    break;
                }
                if (c == ' ' || c == '\t') {
                    state = CONTENT_HEADER_TITLE_START;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HEADER_TITLE_START:
                if (c == ' ' || c == '\t')
                    break;
                start = current;
                if (c != '\n' && c != '\r') {
                    state = CONTENT_HEADER_TITLE;
                    break;
                }

            case CONTENT_HEADER_TITLE:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start, end - start);
                    if (first_header != NULL && *first_header == NULL)
                        *first_header = blogc_htmlentities(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    slug = blogc_slugify(tmp);
                    if (headers != NULL)
                        *headers = blogc_toctree_append(*headers, header_level, slug, parsed);
                    if (slug == NULL)
                        bc_string_append_printf(rv, "<h%d>%s</h%d>%s",
                            header_level, parsed, header_level, line_ending);
                    else
                        bc_string_append_printf(rv, "<h%d id=\"%s\">%s</h%d>%s",
                            header_level, slug, parsed, header_level,
                            line_ending);
                    free(slug);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                break;

            case CONTENT_HTML:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_HTML_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_HTML_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    bc_string_append_printf(rv, "%s%s", tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_HTML;
                break;

            case CONTENT_BLOCKQUOTE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_BLOCKQUOTE_START;
                break;

            case CONTENT_BLOCKQUOTE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_BLOCKQUOTE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        if (is_last) {
                            free(tmp);
                            tmp = NULL;
                            continue;
                        }
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_BLOCKQUOTE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp_str = bc_string_new();
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(tmp_str, "%s%s", l->data,
                            line_ending);
                    // do not propagate title and description to blockquote parsing,
                    // because we just want paragraphs from first level of
                    // content.
                    tmp = blogc_content_parse(tmp_str->str, NULL, NULL, NULL, endl, NULL);
                    bc_string_append_printf(rv, "<blockquote>%s</blockquote>%s",
                        tmp, line_ending);
                    free(tmp);
                    tmp = NULL;
                    bc_string_free(tmp_str, true);
                    tmp_str = NULL;
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_BLOCKQUOTE_START;
                }
                break;

            case CONTENT_CODE:
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_CODE_START;
                break;

            case CONTENT_CODE_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    if (bc_str_starts_with(tmp, prefix)) {
                        lines = bc_slist_append(lines, bc_strdup(tmp + strlen(prefix)));
                        state = CONTENT_CODE_END;
                    }
                    else {
                        state = CONTENT_PARAGRAPH;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        lines = NULL;
                        free(tmp);
                        tmp = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                }
                if (!is_last)
                    break;

            case CONTENT_CODE_END:
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append(rv, "<pre><code>");
                    for (bc_slist_t *l = lines; l != NULL; l = l->next) {
                        char *tmp_line = blogc_htmlentities(l->data);
                        if (l->next == NULL)
                            bc_string_append_printf(rv, "%s", tmp_line);
                        else
                            bc_string_append_printf(rv, "%s%s", tmp_line,
                                line_ending);
                        free(tmp_line);
                    }
                    bc_string_append_printf(rv, "</code></pre>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_CODE_START;
                }
                break;

            case CONTENT_UNORDERED_LIST_OR_HORIZONTAL_RULE_OR_EMPHASIS:
                if (current == start+1) {
                    if (c == d) { // horizontal rule or '**' emphasis
                        state = CONTENT_HORIZONTAL_RULE_OR_EMPHASIS;
                        break;
                    }
                    else if (c != ' ' && c != '\t' && d == '*') { // is '*' emphasis
                        state = CONTENT_PARAGRAPH;
                        break;
                    }
                }
                if (c == ' ' || c == '\t')
                    break;
                prefix = bc_strndup(src + start, current - start);
                state = CONTENT_UNORDERED_LIST_START;
                break;

            case CONTENT_HORIZONTAL_RULE_OR_EMPHASIS:
                // 3rd '-' or '*' required for a horizontal rule
                if (c == d) {
                    state = CONTENT_HORIZONTAL_RULE;
                    if (is_last)
                        continue;
                    break;
                }
                // is '**' emphasis
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_HORIZONTAL_RULE:
                if (c == d && !is_last) {
                    break;
                }
                if (c == '\n' || c == '\r' || is_last) {
                    bc_string_append_printf(rv, "<hr />%s", line_ending);
                    state = CONTENT_START_LINE;
                    start = current;
                    d = '\0';
                    break;
                }
                state = CONTENT_PARAGRAPH;
                break;

            case CONTENT_UNORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", strlen(prefix), "");
                    if (bc_str_starts_with(tmp, prefix)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + strlen(prefix)));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(prefix);
                        prefix = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_UNORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_UNORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ul>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ul>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_UNORDERED_LIST_START;
                }
                break;

            case CONTENT_ORDERED_LIST:
                if (c >= '0' && c <= '9')
                    break;
                if (c == '.') {
                    state = CONTENT_ORDERED_LIST_SPACE;
                    break;
                }
                state = CONTENT_PARAGRAPH;
                if (is_last)
                    continue;
                break;

            case CONTENT_ORDERED_LIST_SPACE:
                if (c == ' ' || c == '\t')
                    break;
                prefix_len = current - start;
                state = CONTENT_ORDERED_LIST_START;
                if (c != '\n' && c != '\r' && !is_last)
                    break;

            case CONTENT_ORDERED_LIST_START:
                if (c == '\n' || c == '\r' || is_last) {
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                    tmp = bc_strndup(src + start2, end - start2);
                    tmp2 = bc_strdup_printf("%-*s", prefix_len, "");
                    if (blogc_is_ordered_list_item(tmp, prefix_len)) {
                        if (lines2 != NULL) {
                            tmp_str = bc_string_new();
                            for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                                if (l->next == NULL)
                                    bc_string_append_printf(tmp_str, "%s", l->data);
                                else
                                    bc_string_append_printf(tmp_str, "%s%s", l->data,
                                        line_ending);
                            }
                            bc_slist_free_full(lines2, free);
                            lines2 = NULL;
                            parsed = blogc_content_parse_inline(tmp_str->str);
                            bc_string_free(tmp_str, true);
                            lines = bc_slist_append(lines, bc_strdup(parsed));
                            free(parsed);
                            parsed = NULL;
                        }
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else if (bc_str_starts_with(tmp, tmp2)) {
                        lines2 = bc_slist_append(lines2, bc_strdup(tmp + prefix_len));
                    }
                    else {
                        state = CONTENT_PARAGRAPH_END;
                        free(tmp);
                        tmp = NULL;
                        free(tmp2);
                        tmp2 = NULL;
                        free(parsed);
                        parsed = NULL;
                        bc_slist_free_full(lines, free);
                        bc_slist_free_full(lines2, free);
                        lines = NULL;
                        if (is_last)
                            continue;
                        break;
                    }
                    free(tmp);
                    tmp = NULL;
                    free(tmp2);
                    tmp2 = NULL;
                    state = CONTENT_ORDERED_LIST_END;
                }
                if (!is_last)
                    break;

            case CONTENT_ORDERED_LIST_END:
                if (c == '\n' || c == '\r' || is_last) {
                    if (lines2 != NULL) {
                        // FIXME: avoid repeting the code below
                        tmp_str = bc_string_new();
                        for (bc_slist_t *l = lines2; l != NULL; l = l->next) {
                            if (l->next == NULL)
                                bc_string_append_printf(tmp_str, "%s", l->data);
                            else
                                bc_string_append_printf(tmp_str, "%s%s", l->data,
                                    line_ending);
                        }
                        bc_slist_free_full(lines2, free);
                        lines2 = NULL;
                        parsed = blogc_content_parse_inline(tmp_str->str);
                        bc_string_free(tmp_str, true);
                        lines = bc_slist_append(lines, bc_strdup(parsed));
                        free(parsed);
                        parsed = NULL;
                    }
                    bc_string_append_printf(rv, "<ol>%s", line_ending);
                    for (bc_slist_t *l = lines; l != NULL; l = l->next)
                        bc_string_append_printf(rv, "<li>%s</li>%s", l->data,
                            line_ending);
                    bc_string_append_printf(rv, "</ol>%s", line_ending);
                    bc_slist_free_full(lines, free);
                    lines = NULL;
                    free(prefix);
                    prefix = NULL;
                    state = CONTENT_START_LINE;
                    start2 = current;
                }
                else {
                    start2 = current;
                    state = CONTENT_ORDERED_LIST_START;
                }
                break;

            case CONTENT_PARAGRAPH:
                if (c == '\n' || c == '\r' || is_last) {
                    state = CONTENT_PARAGRAPH_END;
                    end = is_last && c != '\n' && c != '\r' ? src_len :
                        (real_end != 0 ? real_end : current);
                }
                if (!is_last)
                    break;

            case CONTENT_PARAGRAPH_END:
                if (c == '\n' || c == '\r' || is_last) {
                    tmp = bc_strndup(src + start, end - start);
                    if (description != NULL && *description == NULL)
                        *description = blogc_fix_description(tmp);
                    parsed = blogc_content_parse_inline(tmp);
                    bc_string_append_printf(rv, "<p>%s</p>%s", parsed,
                        line_ending);
                    free(parsed);
                    parsed = NULL;
                    free(tmp);
                    tmp = NULL;
                    state = CONTENT_START_LINE;
                    start = current;
                }
                else
                    state = CONTENT_PARAGRAPH;
                break;

        }

        current++;
    }

    if (endl == NULL) {
        free(line_ending);
    }

    return bc_string_free(rv, false);
}